

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void crypto::sha256_transform::transform(hash_word *state,hash_word *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *in_RSI;
  int *in_RDI;
  size_t j;
  hash_word T [8];
  hash_word W [16];
  ulong local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint *local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_58,0,0x40);
  local_78 = *(undefined8 *)local_8;
  local_70 = *(undefined8 *)(local_8 + 2);
  local_68 = *(undefined8 *)(local_8 + 4);
  local_60 = *(undefined8 *)(local_8 + 6);
  for (local_80 = 0; local_80 < 0x40; local_80 = local_80 + 0x10) {
    uVar1 = util::rotr_fixed<unsigned_int>((uint)local_68,6);
    uVar2 = util::rotr_fixed<unsigned_int>((uint)local_68,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>((uint)local_68,0x19);
    iVar9 = *(int *)(sha256_k + local_80 * 4);
    if (local_80 == 0) {
      local_58 = *local_10;
    }
    else {
      uVar4 = util::rotr_fixed<unsigned_int>(local_20,0x11);
      uVar5 = util::rotr_fixed<unsigned_int>(local_20,0x13);
      iVar6 = (uVar4 ^ uVar5 ^ local_20 >> 10) + local_34;
      uVar4 = util::rotr_fixed<unsigned_int>(local_54,7);
      uVar5 = util::rotr_fixed<unsigned_int>(local_54,0x12);
      local_58 = iVar6 + (uVar4 ^ uVar5 ^ local_54 >> 3) + local_58;
    }
    local_60._4_4_ =
         (uVar1 ^ uVar2 ^ uVar3) +
         ((uint)local_60 ^ (uint)local_68 & (local_68._4_4_ ^ (uint)local_60)) + iVar9 + local_58 +
         local_60._4_4_;
    uVar1 = local_60._4_4_ + local_70._4_4_;
    uVar2 = util::rotr_fixed<unsigned_int>((uint)local_78,2);
    uVar3 = util::rotr_fixed<unsigned_int>((uint)local_78,0xd);
    uVar4 = util::rotr_fixed<unsigned_int>((uint)local_78,0x16);
    uVar5 = (uVar2 ^ uVar3 ^ uVar4) +
            (local_78._4_4_ ^ ((uint)local_78 ^ local_78._4_4_) & (local_78._4_4_ ^ (uint)local_70))
            + local_60._4_4_;
    uVar2 = util::rotr_fixed<unsigned_int>(uVar1,6);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar1,0xb);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar1,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 1) * 4);
    if (local_80 == 0) {
      local_54 = local_10[1];
    }
    else {
      uVar7 = util::rotr_fixed<unsigned_int>(local_1c,0x11);
      uVar8 = util::rotr_fixed<unsigned_int>(local_1c,0x13);
      iVar6 = (uVar7 ^ uVar8 ^ local_1c >> 10) + local_30;
      uVar7 = util::rotr_fixed<unsigned_int>(local_50,7);
      uVar8 = util::rotr_fixed<unsigned_int>(local_50,0x12);
      local_54 = iVar6 + (uVar7 ^ uVar8 ^ local_50 >> 3) + local_54;
    }
    iVar9 = (uVar2 ^ uVar3 ^ uVar4) + (local_68._4_4_ ^ uVar1 & ((uint)local_68 ^ local_68._4_4_)) +
            iVar9 + local_54 + (uint)local_60;
    local_70._0_4_ = iVar9 + (uint)local_70;
    uVar2 = util::rotr_fixed<unsigned_int>(uVar5,2);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar5,0xd);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar5,0x16);
    uVar7 = (uVar2 ^ uVar3 ^ uVar4) +
            ((uint)local_78 ^ (uVar5 ^ (uint)local_78) & ((uint)local_78 ^ local_78._4_4_)) + iVar9;
    uVar2 = util::rotr_fixed<unsigned_int>((uint)local_70,6);
    uVar3 = util::rotr_fixed<unsigned_int>((uint)local_70,0xb);
    uVar4 = util::rotr_fixed<unsigned_int>((uint)local_70,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 2) * 4);
    if (local_80 == 0) {
      local_50 = local_10[2];
    }
    else {
      uVar8 = util::rotr_fixed<unsigned_int>(local_58,0x11);
      uVar10 = util::rotr_fixed<unsigned_int>(local_58,0x13);
      iVar6 = (uVar8 ^ uVar10 ^ local_58 >> 10) + local_2c;
      uVar8 = util::rotr_fixed<unsigned_int>(local_4c,7);
      uVar10 = util::rotr_fixed<unsigned_int>(local_4c,0x12);
      local_50 = iVar6 + (uVar8 ^ uVar10 ^ local_4c >> 3) + local_50;
    }
    iVar9 = (uVar2 ^ uVar3 ^ uVar4) + ((uint)local_68 ^ (uint)local_70 & (uVar1 ^ (uint)local_68)) +
            iVar9 + local_50 + local_68._4_4_;
    local_78._4_4_ = iVar9 + local_78._4_4_;
    uVar2 = util::rotr_fixed<unsigned_int>(uVar7,2);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar7,0xd);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar7,0x16);
    uVar8 = (uVar2 ^ uVar3 ^ uVar4) + (uVar5 ^ (uVar7 ^ uVar5) & (uVar5 ^ (uint)local_78)) + iVar9;
    uVar2 = util::rotr_fixed<unsigned_int>(local_78._4_4_,6);
    uVar3 = util::rotr_fixed<unsigned_int>(local_78._4_4_,0xb);
    uVar4 = util::rotr_fixed<unsigned_int>(local_78._4_4_,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 3) * 4);
    if (local_80 == 0) {
      local_4c = local_10[3];
    }
    else {
      uVar10 = util::rotr_fixed<unsigned_int>(local_54,0x11);
      uVar11 = util::rotr_fixed<unsigned_int>(local_54,0x13);
      iVar6 = (uVar10 ^ uVar11 ^ local_54 >> 10) + local_28;
      uVar10 = util::rotr_fixed<unsigned_int>(local_48,7);
      uVar11 = util::rotr_fixed<unsigned_int>(local_48,0x12);
      local_4c = iVar6 + (uVar10 ^ uVar11 ^ local_48 >> 3) + local_4c;
    }
    iVar9 = (uVar2 ^ uVar3 ^ uVar4) + (uVar1 ^ local_78._4_4_ & ((uint)local_70 ^ uVar1)) + iVar9 +
            local_4c + (uint)local_68;
    local_78._0_4_ = iVar9 + (uint)local_78;
    uVar2 = util::rotr_fixed<unsigned_int>(uVar8,2);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar8,0xd);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar8,0x16);
    uVar10 = (uVar2 ^ uVar3 ^ uVar4) + (uVar7 ^ (uVar8 ^ uVar7) & (uVar7 ^ uVar5)) + iVar9;
    uVar2 = util::rotr_fixed<unsigned_int>((uint)local_78,6);
    uVar3 = util::rotr_fixed<unsigned_int>((uint)local_78,0xb);
    uVar4 = util::rotr_fixed<unsigned_int>((uint)local_78,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 4) * 4);
    if (local_80 == 0) {
      local_48 = local_10[4];
    }
    else {
      uVar11 = util::rotr_fixed<unsigned_int>(local_50,0x11);
      uVar12 = util::rotr_fixed<unsigned_int>(local_50,0x13);
      iVar6 = (uVar11 ^ uVar12 ^ local_50 >> 10) + local_24;
      uVar11 = util::rotr_fixed<unsigned_int>(local_44,7);
      uVar12 = util::rotr_fixed<unsigned_int>(local_44,0x12);
      local_48 = iVar6 + (uVar11 ^ uVar12 ^ local_44 >> 3) + local_48;
    }
    iVar9 = (uVar2 ^ uVar3 ^ uVar4) +
            ((uint)local_70 ^ (uint)local_78 & (local_78._4_4_ ^ (uint)local_70)) + iVar9 + local_48
            + uVar1;
    uVar5 = iVar9 + uVar5;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar10,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar10,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar10,0x16);
    uVar4 = (uVar1 ^ uVar2 ^ uVar3) + (uVar8 ^ (uVar10 ^ uVar8) & (uVar8 ^ uVar7)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar5,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar5,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar5,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 5) * 4);
    if (local_80 == 0) {
      local_44 = local_10[5];
    }
    else {
      uVar11 = util::rotr_fixed<unsigned_int>(local_4c,0x11);
      uVar12 = util::rotr_fixed<unsigned_int>(local_4c,0x13);
      iVar6 = (uVar11 ^ uVar12 ^ local_4c >> 10) + local_20;
      uVar11 = util::rotr_fixed<unsigned_int>(local_40,7);
      uVar12 = util::rotr_fixed<unsigned_int>(local_40,0x12);
      local_44 = iVar6 + (uVar11 ^ uVar12 ^ local_40 >> 3) + local_44;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + (local_78._4_4_ ^ uVar5 & ((uint)local_78 ^ local_78._4_4_)) +
            iVar9 + local_44 + (uint)local_70;
    uVar7 = iVar9 + uVar7;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar4,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar4,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar4,0x16);
    uVar11 = (uVar1 ^ uVar2 ^ uVar3) + (uVar10 ^ (uVar4 ^ uVar10) & (uVar10 ^ uVar8)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar7,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar7,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar7,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 6) * 4);
    if (local_80 == 0) {
      local_40 = local_10[6];
    }
    else {
      uVar12 = util::rotr_fixed<unsigned_int>(local_48,0x11);
      uVar13 = util::rotr_fixed<unsigned_int>(local_48,0x13);
      iVar6 = (uVar12 ^ uVar13 ^ local_48 >> 10) + local_1c;
      uVar12 = util::rotr_fixed<unsigned_int>(local_3c,7);
      uVar13 = util::rotr_fixed<unsigned_int>(local_3c,0x12);
      local_40 = iVar6 + (uVar12 ^ uVar13 ^ local_3c >> 3) + local_40;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + ((uint)local_78 ^ uVar7 & (uVar5 ^ (uint)local_78)) + iVar9 +
            local_40 + local_78._4_4_;
    uVar8 = iVar9 + uVar8;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar11,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar11,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar11,0x16);
    uVar12 = (uVar1 ^ uVar2 ^ uVar3) + (uVar4 ^ (uVar11 ^ uVar4) & (uVar4 ^ uVar10)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar8,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar8,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar8,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 7) * 4);
    if (local_80 == 0) {
      local_3c = local_10[7];
    }
    else {
      uVar13 = util::rotr_fixed<unsigned_int>(local_44,0x11);
      uVar14 = util::rotr_fixed<unsigned_int>(local_44,0x13);
      iVar6 = (uVar13 ^ uVar14 ^ local_44 >> 10) + local_58;
      uVar13 = util::rotr_fixed<unsigned_int>(local_38,7);
      uVar14 = util::rotr_fixed<unsigned_int>(local_38,0x12);
      local_3c = iVar6 + (uVar13 ^ uVar14 ^ local_38 >> 3) + local_3c;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + (uVar5 ^ uVar8 & (uVar7 ^ uVar5)) + iVar9 + local_3c +
            (uint)local_78;
    uVar10 = iVar9 + uVar10;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar12,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar12,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar12,0x16);
    uVar13 = (uVar1 ^ uVar2 ^ uVar3) + (uVar11 ^ (uVar12 ^ uVar11) & (uVar11 ^ uVar4)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar10,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar10,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar10,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 8) * 4);
    if (local_80 == 0) {
      local_38 = local_10[8];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_40,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_40,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_40 >> 10) + local_54;
      uVar14 = util::rotr_fixed<unsigned_int>(local_34,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_34,0x12);
      local_38 = iVar6 + (uVar14 ^ uVar15 ^ local_34 >> 3) + local_38;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + (uVar7 ^ uVar10 & (uVar8 ^ uVar7)) + iVar9 + local_38 + uVar5;
    uVar4 = iVar9 + uVar4;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar13,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar13,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar13,0x16);
    uVar5 = (uVar1 ^ uVar2 ^ uVar3) + (uVar12 ^ (uVar13 ^ uVar12) & (uVar12 ^ uVar11)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar4,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar4,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar4,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 9) * 4);
    if (local_80 == 0) {
      local_34 = local_10[9];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_3c,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_3c,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_3c >> 10) + local_50;
      uVar14 = util::rotr_fixed<unsigned_int>(local_30,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_30,0x12);
      local_34 = iVar6 + (uVar14 ^ uVar15 ^ local_30 >> 3) + local_34;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + (uVar8 ^ uVar4 & (uVar10 ^ uVar8)) + iVar9 + local_34 + uVar7;
    uVar11 = iVar9 + uVar11;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar5,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar5,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar5,0x16);
    uVar7 = (uVar1 ^ uVar2 ^ uVar3) + (uVar13 ^ (uVar5 ^ uVar13) & (uVar13 ^ uVar12)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar11,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar11,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar11,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 10) * 4);
    if (local_80 == 0) {
      local_30 = local_10[10];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_38,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_38,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_38 >> 10) + local_4c;
      uVar14 = util::rotr_fixed<unsigned_int>(local_2c,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_2c,0x12);
      local_30 = iVar6 + (uVar14 ^ uVar15 ^ local_2c >> 3) + local_30;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + (uVar10 ^ uVar11 & (uVar4 ^ uVar10)) + iVar9 + local_30 +
            uVar8;
    uVar12 = iVar9 + uVar12;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar7,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar7,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar7,0x16);
    uVar8 = (uVar1 ^ uVar2 ^ uVar3) + (uVar5 ^ (uVar7 ^ uVar5) & (uVar5 ^ uVar13)) + iVar9;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar12,6);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar12,0xb);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar12,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 0xb) * 4);
    if (local_80 == 0) {
      local_2c = local_10[0xb];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_34,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_34,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_34 >> 10) + local_48;
      uVar14 = util::rotr_fixed<unsigned_int>(local_28,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_28,0x12);
      local_2c = iVar6 + (uVar14 ^ uVar15 ^ local_28 >> 3) + local_2c;
    }
    iVar9 = (uVar1 ^ uVar2 ^ uVar3) + (uVar4 ^ uVar12 & (uVar11 ^ uVar4)) + iVar9 + local_2c +
            uVar10;
    uVar13 = iVar9 + uVar13;
    uVar1 = util::rotr_fixed<unsigned_int>(uVar8,2);
    uVar2 = util::rotr_fixed<unsigned_int>(uVar8,0xd);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar8,0x16);
    uVar1 = (uVar1 ^ uVar2 ^ uVar3) + (uVar7 ^ (uVar8 ^ uVar7) & (uVar7 ^ uVar5)) + iVar9;
    uVar2 = util::rotr_fixed<unsigned_int>(uVar13,6);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar13,0xb);
    uVar10 = util::rotr_fixed<unsigned_int>(uVar13,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 0xc) * 4);
    if (local_80 == 0) {
      local_28 = local_10[0xc];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_30,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_30,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_30 >> 10) + local_44;
      uVar14 = util::rotr_fixed<unsigned_int>(local_24,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_24,0x12);
      local_28 = iVar6 + (uVar14 ^ uVar15 ^ local_24 >> 3) + local_28;
    }
    iVar9 = (uVar2 ^ uVar3 ^ uVar10) + (uVar11 ^ uVar13 & (uVar12 ^ uVar11)) + iVar9 + local_28 +
            uVar4;
    uVar5 = iVar9 + uVar5;
    uVar2 = util::rotr_fixed<unsigned_int>(uVar1,2);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar1,0xd);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar1,0x16);
    uVar2 = (uVar2 ^ uVar3 ^ uVar4) + (uVar8 ^ (uVar1 ^ uVar8) & (uVar8 ^ uVar7)) + iVar9;
    uVar3 = util::rotr_fixed<unsigned_int>(uVar5,6);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar5,0xb);
    uVar10 = util::rotr_fixed<unsigned_int>(uVar5,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 0xd) * 4);
    if (local_80 == 0) {
      local_24 = local_10[0xd];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_2c,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_2c,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_2c >> 10) + local_40;
      uVar14 = util::rotr_fixed<unsigned_int>(local_20,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_20,0x12);
      local_24 = iVar6 + (uVar14 ^ uVar15 ^ local_20 >> 3) + local_24;
    }
    iVar9 = (uVar3 ^ uVar4 ^ uVar10) + (uVar12 ^ uVar5 & (uVar13 ^ uVar12)) + iVar9 + local_24 +
            uVar11;
    uVar7 = iVar9 + uVar7;
    local_60 = CONCAT44(uVar5,uVar7);
    uVar3 = util::rotr_fixed<unsigned_int>(uVar2,2);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar2,0xd);
    uVar10 = util::rotr_fixed<unsigned_int>(uVar2,0x16);
    uVar3 = (uVar3 ^ uVar4 ^ uVar10) + (uVar1 ^ (uVar2 ^ uVar1) & (uVar1 ^ uVar8)) + iVar9;
    local_70 = CONCAT44(uVar2,uVar3);
    uVar4 = util::rotr_fixed<unsigned_int>(uVar7,6);
    uVar10 = util::rotr_fixed<unsigned_int>(uVar7,0xb);
    uVar11 = util::rotr_fixed<unsigned_int>(uVar7,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 0xe) * 4);
    if (local_80 == 0) {
      local_20 = local_10[0xe];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_28,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_28,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_28 >> 10) + local_3c;
      uVar14 = util::rotr_fixed<unsigned_int>(local_1c,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_1c,0x12);
      local_20 = iVar6 + (uVar14 ^ uVar15 ^ local_1c >> 3) + local_20;
    }
    iVar9 = (uVar4 ^ uVar10 ^ uVar11) + (uVar13 ^ uVar7 & (uVar5 ^ uVar13)) + iVar9 + local_20 +
            uVar12;
    uVar8 = iVar9 + uVar8;
    uVar4 = util::rotr_fixed<unsigned_int>(uVar3,2);
    uVar10 = util::rotr_fixed<unsigned_int>(uVar3,0xd);
    uVar11 = util::rotr_fixed<unsigned_int>(uVar3,0x16);
    uVar4 = (uVar4 ^ uVar10 ^ uVar11) + (uVar2 ^ (uVar3 ^ uVar2) & (uVar2 ^ uVar1)) + iVar9;
    uVar10 = util::rotr_fixed<unsigned_int>(uVar8,6);
    uVar11 = util::rotr_fixed<unsigned_int>(uVar8,0xb);
    uVar12 = util::rotr_fixed<unsigned_int>(uVar8,0x19);
    iVar9 = *(int *)(sha256_k + (local_80 + 0xf) * 4);
    if (local_80 == 0) {
      local_1c = local_10[0xf];
    }
    else {
      uVar14 = util::rotr_fixed<unsigned_int>(local_24,0x11);
      uVar15 = util::rotr_fixed<unsigned_int>(local_24,0x13);
      iVar6 = (uVar14 ^ uVar15 ^ local_24 >> 10) + local_38;
      uVar14 = util::rotr_fixed<unsigned_int>(local_58,7);
      uVar15 = util::rotr_fixed<unsigned_int>(local_58,0x12);
      local_1c = iVar6 + (uVar14 ^ uVar15 ^ local_58 >> 3) + local_1c;
    }
    iVar9 = (uVar10 ^ uVar11 ^ uVar12) + (uVar5 ^ uVar8 & (uVar7 ^ uVar5)) + iVar9 + local_1c +
            uVar13;
    local_68 = CONCAT44(uVar8,iVar9 + uVar1);
    uVar1 = util::rotr_fixed<unsigned_int>(uVar4,2);
    uVar5 = util::rotr_fixed<unsigned_int>(uVar4,0xd);
    uVar7 = util::rotr_fixed<unsigned_int>(uVar4,0x16);
    local_78 = CONCAT44(uVar4,(uVar1 ^ uVar5 ^ uVar7) + (uVar3 ^ (uVar4 ^ uVar3) & (uVar3 ^ uVar2))
                              + iVar9);
  }
  *local_8 = (uint)local_78 + *local_8;
  local_8[1] = local_78._4_4_ + local_8[1];
  local_8[2] = (uint)local_70 + local_8[2];
  local_8[3] = local_70._4_4_ + local_8[3];
  local_8[4] = (uint)local_68 + local_8[4];
  local_8[5] = local_68._4_4_ + local_8[5];
  local_8[6] = (uint)local_60 + local_8[6];
  local_8[7] = local_60._4_4_ + local_8[7];
  return;
}

Assistant:

void sha256_transform::transform(hash_word * state, const hash_word * data) {
	
	#define a(i) T[(0 - i) & 7]
	#define b(i) T[(1 - i) & 7]
	#define c(i) T[(2 - i) & 7]
	#define d(i) T[(3 - i) & 7]
	#define e(i) T[(4 - i) & 7]
	#define f(i) T[(5 - i) & 7]
	#define g(i) T[(6 - i) & 7]
	#define h(i) T[(7 - i) & 7]
	
	#define blk0(i) (W[i] = data[i])
	#define blk2(i) (W[i & 15] += s1(W[(i - 2) & 15]) + W[(i - 7) & 15] + s0(W[(i - 15) & 15]))
	
	#define Ch(x, y, z) (z ^ (x & (y ^ z)))
	#define Maj(x, y, z) (y ^ ((x ^ y) & (y ^ z)))
	
	#define R(i) \
		h(i) += S1(e(i)) + Ch(e(i), f(i), g(i)) + sha256_k[i + j] + (j ? blk2(i) : blk0(i)); \
		d(i) += h(i); \
		h(i) += S0(a(i)) + Maj(a(i), b(i), c(i))
	
	#define s0(x) (util::rotr_fixed(x, 7) ^ util::rotr_fixed(x, 18) ^ (x >> 3))
	#define s1(x) (util::rotr_fixed(x, 17) ^ util::rotr_fixed(x, 19) ^ (x >> 10))
	#define S0(x) (util::rotr_fixed(x, 2) ^ util::rotr_fixed(x, 13) ^ util::rotr_fixed(x, 22))
	#define S1(x) (util::rotr_fixed(x, 6) ^ util::rotr_fixed(x, 11) ^ util::rotr_fixed(x, 25))
	
	hash_word W[16] = {0}, T[8];
	
	/* Copy context->state to working vars */
	std::memcpy(T, state, sizeof(T));
	
	/* 64 operations, partially loop unrolled */
	for(size_t j = 0; j < 64; j += 16) {
		R(0);
		R(1);
		R(2);
		R(3);
		R(4);
		R(5);
		R(6);
		R(7);
		R(8);
		R(9);
		R(10);
		R(11);
		R(12);
		R(13);
		R(14);
		R(15);
	}
	
	/* Add the working vars back into context.state[] */
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
	
	#undef Ch
	#undef Maj
	#undef s0
	#undef s1
	#undef S0
	#undef S1
	#undef blk0
	#undef blk1
	#undef blk2
	#undef R
	
	#undef a
	#undef b
	#undef c
	#undef d
	#undef e
	#undef f
	#undef g
	#undef h
	
}